

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::TimingPathSymbol::serializeTo(TimingPathSymbol *this,ASTSerializer *serializer)

{
  Expression *pEVar1;
  size_t sVar2;
  long lVar3;
  string_view sVar4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar5;
  string_view name;
  string_view name_00;
  
  ASTSerializer::write
            (serializer,0xe,"connectionKind",(ulong)(this->connectionKind != Full) * 4 + 4);
  sVar2 = 7;
  if (this->polarity != Unknown) {
    sVar2 = 8;
  }
  ASTSerializer::write(serializer,8,"polarity",sVar2);
  sVar2 = 7;
  if (this->edgePolarity != Unknown) {
    sVar2 = 8;
  }
  ASTSerializer::write(serializer,0xc,"edgePolarity",sVar2);
  sVar4 = ast::toString(this->edgeIdentifier);
  ASTSerializer::write(serializer,0xe,"edgeIdentifier",sVar4._M_len);
  ASTSerializer::write(serializer,0x10,"isStateDependent",(ulong)this->isStateDependent);
  pEVar1 = getEdgeSourceExpr(this);
  if (pEVar1 != (Expression *)0x0) {
    ASTSerializer::write(serializer,0xe,"edgeSourceExpr",(size_t)pEVar1);
  }
  pEVar1 = getConditionExpr(this);
  if (pEVar1 != (Expression *)0x0) {
    ASTSerializer::write(serializer,0xd,"conditionExpr",(size_t)pEVar1);
  }
  sVar4._M_str = "inputs";
  sVar4._M_len = 6;
  ASTSerializer::startArray(serializer,sVar4);
  sVar5 = getInputs(this);
  for (lVar3 = 0; sVar5._M_extent._M_extent_value._M_extent_value << 3 != lVar3; lVar3 = lVar3 + 8)
  {
    ASTSerializer::serialize(serializer,*(Expression **)((long)sVar5._M_ptr + lVar3));
  }
  ASTSerializer::endArray(serializer);
  name._M_str = "outputs";
  name._M_len = 7;
  ASTSerializer::startArray(serializer,name);
  sVar5 = getOutputs(this);
  for (lVar3 = 0; sVar5._M_extent._M_extent_value._M_extent_value << 3 != lVar3; lVar3 = lVar3 + 8)
  {
    ASTSerializer::serialize(serializer,*(Expression **)((long)sVar5._M_ptr + lVar3));
  }
  ASTSerializer::endArray(serializer);
  name_00._M_str = "delays";
  name_00._M_len = 6;
  ASTSerializer::startArray(serializer,name_00);
  sVar5 = getDelays(this);
  for (lVar3 = 0; sVar5._M_extent._M_extent_value._M_extent_value << 3 != lVar3; lVar3 = lVar3 + 8)
  {
    ASTSerializer::serialize(serializer,*(Expression **)((long)sVar5._M_ptr + lVar3));
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void TimingPathSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("connectionKind",
                     connectionKind == ConnectionKind::Full ? "Full"sv : "Parallel"sv);
    serializer.write("polarity", toString(polarity));
    serializer.write("edgePolarity", toString(edgePolarity));
    serializer.write("edgeIdentifier", toString(edgeIdentifier));
    serializer.write("isStateDependent", isStateDependent);

    if (auto expr = getEdgeSourceExpr())
        serializer.write("edgeSourceExpr", *expr);

    if (auto expr = getConditionExpr())
        serializer.write("conditionExpr", *expr);

    serializer.startArray("inputs");
    for (auto expr : getInputs())
        serializer.serialize(*expr);
    serializer.endArray();

    serializer.startArray("outputs");
    for (auto expr : getOutputs())
        serializer.serialize(*expr);
    serializer.endArray();

    serializer.startArray("delays");
    for (auto expr : getDelays())
        serializer.serialize(*expr);
    serializer.endArray();
}